

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlifMv.c
# Opt level: O3

void Io_WriteBlifMv(Abc_Ntk_t *pNtk,char *FileName)

{
  char *pcVar1;
  Abc_Ntk_t *pNtk_00;
  FILE *__stream;
  char *pcVar2;
  Abc_Des_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlifMv.c"
                  ,0x3f,"void Io_WriteBlifMv(Abc_Ntk_t *, char *)");
  }
  if (pNtk->ntkFunc == ABC_FUNC_BLIFMV) {
    __stream = fopen(FileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar1 = pNtk->pName;
      pcVar2 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar2);
      Io_NtkWriteBlifMv((FILE *)__stream,pNtk);
      pAVar3 = pNtk->pDesign;
      if ((pAVar3 != (Abc_Des_t *)0x0) && (pVVar4 = pAVar3->vModules, 0 < pVVar4->nSize)) {
        lVar5 = 0;
        do {
          pNtk_00 = (Abc_Ntk_t *)pVVar4->pArray[lVar5];
          if (pNtk_00 != pNtk) {
            fwrite("\n\n",2,1,__stream);
            Io_NtkWriteBlifMv((FILE *)__stream,pNtk_00);
            pAVar3 = pNtk->pDesign;
          }
          lVar5 = lVar5 + 1;
          pVVar4 = pAVar3->vModules;
        } while (lVar5 < pVVar4->nSize);
      }
      fclose(__stream);
      return;
    }
    fwrite("Io_WriteBlifMv(): Cannot open the output file.\n",0x2f,1,_stdout);
    return;
  }
  __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlifMv.c"
                ,0x40,"void Io_WriteBlifMv(Abc_Ntk_t *, char *)");
}

Assistant:

void Io_WriteBlifMv( Abc_Ntk_t * pNtk, char * FileName )
{
    FILE * pFile;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlifMv(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the master network
    Io_NtkWriteBlifMv( pFile, pNtk );
    // write the remaining networks
    if ( pNtk->pDesign )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            fprintf( pFile, "\n\n" );
            Io_NtkWriteBlifMv( pFile, pNtkTemp );
        }
    }
    fclose( pFile );
}